

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFrameBuffer.cpp
# Opt level: O3

void __thiscall Imf_3_4::FrameBuffer::insert(FrameBuffer *this,char *name,Slice *slice)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  double dVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  mapped_type *pmVar9;
  ArgExc *this_00;
  stringstream _iex_throw_s;
  key_type local_1a0;
  
  if (*name != '\0') {
    strncpy(local_1a0._text,name,0xff);
    local_1a0._text[0xff] = '\0';
    pmVar9 = std::
             map<Imf_3_4::Name,_Imf_3_4::Slice,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
             ::operator[](&this->_map,&local_1a0);
    uVar5 = *(undefined4 *)&slice->field_0x4;
    pcVar1 = slice->base;
    sVar2 = slice->xStride;
    sVar3 = slice->yStride;
    iVar6 = slice->xSampling;
    iVar7 = slice->ySampling;
    dVar4 = slice->fillValue;
    pmVar9->type = slice->type;
    *(undefined4 *)&pmVar9->field_0x4 = uVar5;
    pmVar9->base = pcVar1;
    pmVar9->xStride = sVar2;
    pmVar9->yStride = sVar3;
    pmVar9->xSampling = iVar6;
    pmVar9->ySampling = iVar7;
    pmVar9->fillValue = dVar4;
    bVar8 = slice->yTileCoords;
    pmVar9->xTileCoords = slice->xTileCoords;
    pmVar9->yTileCoords = bVar8;
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1a0._text + 0x10),
             "Frame buffer slice name cannot be an empty string.",0x32);
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,(stringstream *)&local_1a0);
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
FrameBuffer::insert (const char name[], const Slice& slice)
{
    if (name[0] == 0)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Frame buffer slice name cannot be an empty string.");
    }

    _map[name] = slice;
}